

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmevent.c
# Opt level: O2

void lj_vmevent_call(lua_State *L,ptrdiff_t argbase)

{
  byte bVar1;
  undefined1 uVar2;
  int iVar3;
  char *__s;
  ulong uVar4;
  
  uVar4 = (ulong)(L->glref).ptr32;
  bVar1 = *(byte *)(uVar4 + 0x91);
  uVar2 = *(undefined1 *)(uVar4 + 0x93);
  *(undefined1 *)(uVar4 + 0x93) = 0;
  *(byte *)(uVar4 + 0x91) = bVar1 | 0x30;
  iVar3 = lj_vm_pcall(L,argbase + (ulong)(L->stack).ptr32,1,0);
  if (iVar3 != 0) {
    L->top = L->top + -1;
    fputs("VM handler failed: ",_stderr);
    if ((L->top->field_2).it == 0xfffffffb) {
      __s = (char *)((ulong)(L->top->u32).lo + 0x10);
    }
    else {
      __s = "?";
    }
    fputs(__s,_stderr);
    fputc(10,_stderr);
  }
  *(byte *)(uVar4 + 0x91) = *(byte *)(uVar4 + 0x91) & 0xf | bVar1 & 0xf0;
  if (*(char *)(uVar4 + 0x93) != -1) {
    *(undefined1 *)(uVar4 + 0x93) = uVar2;
  }
  return;
}

Assistant:

void lj_vmevent_call(lua_State *L, ptrdiff_t argbase)
{
  global_State *g = G(L);
  uint8_t oldmask = g->vmevmask;
  uint8_t oldh = hook_save(g);
  int status;
  g->vmevmask = 0;  /* Disable all events. */
  hook_vmevent(g);
  status = lj_vm_pcall(L, restorestack(L, argbase), 0+1, 0);
  if (LJ_UNLIKELY(status)) {
    /* Really shouldn't use stderr here, but where else to complain? */
    L->top--;
    fputs("VM handler failed: ", stderr);
    fputs(tvisstr(L->top) ? strVdata(L->top) : "?", stderr);
    fputc('\n', stderr);
  }
  hook_restore(g, oldh);
  if (g->vmevmask != VMEVENT_NOCACHE)
    g->vmevmask = oldmask;  /* Restore event mask, but not if not modified. */
}